

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O3

int flv_read_tag(FILE *flv,flvtag_t *tag)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *__ptr;
  uint uVar3;
  ulong uVar4;
  uint8_t h [11];
  undefined1 local_2b;
  byte bStack_2a;
  byte bStack_29;
  uint uStack_28;
  undefined4 uStack_24;
  
  sVar2 = fread(&local_2b,1,0xb,(FILE *)flv);
  uVar1 = 0;
  if (sVar2 == 0xb) {
    uVar3 = (uint)bStack_29 << 8 | (uint)bStack_2a << 0x10;
    uVar1 = uStack_28 & 0xff;
    uVar4 = (ulong)(uVar1 + uVar3 + 0xf);
    __ptr = tag->data;
    if (tag->aloc < uVar4) {
      __ptr = (uint8_t *)realloc(__ptr,uVar4);
      tag->data = __ptr;
      tag->aloc = uVar4;
    }
    *(undefined4 *)(__ptr + 7) = uStack_24;
    *(ulong *)__ptr =
         CONCAT17((undefined1)uStack_24,
                  CONCAT43(uStack_28,CONCAT12(bStack_29,CONCAT11(bStack_2a,local_2b))));
    uVar4 = (ulong)(uVar3 + uVar1 + 4);
    sVar2 = fread(tag->data + 0xb,1,uVar4,(FILE *)flv);
    uVar1 = (uint)(sVar2 == uVar4);
  }
  return uVar1;
}

Assistant:

int flv_read_tag(FILE* flv, flvtag_t* tag)
{
    uint32_t size;
    uint8_t h[FLV_TAG_HEADER_SIZE];

    if (FLV_TAG_HEADER_SIZE != fread(&h[0], 1, FLV_TAG_HEADER_SIZE, flv)) {
        return 0;
    }

    size = ((h[1] << 16) | (h[2] << 8) | h[3]);
    flvtag_reserve(tag, size);
    // copy header to buffer
    memcpy(tag->data, &h[0], FLV_TAG_HEADER_SIZE);

    if (size + FLV_TAG_FOOTER_SIZE != fread(&tag->data[FLV_TAG_HEADER_SIZE], 1, size + FLV_TAG_FOOTER_SIZE, flv)) {
        return 0;
    }

    return 1;
}